

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::BasicReporter::~BasicReporter(BasicReporter *this)

{
  (this->super_SharedImpl<Catch::IReporter>).super_IReporter.super_IShared.super_NonCopyable.
  _vptr_NonCopyable = (_func_int **)&PTR__BasicReporter_0016d1c0;
  std::vector<Catch::BasicReporter::SpanInfo,_std::allocator<Catch::BasicReporter::SpanInfo>_>::
  ~vector(&this->m_sectionSpans);
  std::__cxx11::string::~string((string *)&this->m_testSpan);
  std::__cxx11::string::~string((string *)&this->m_groupSpan);
  std::__cxx11::string::~string((string *)&this->m_testingSpan);
  Ptr<Catch::IConfig>::~Ptr(&(this->m_config).m_fullConfig);
  IReporter::~IReporter((IReporter *)this);
  return;
}

Assistant:

BasicReporter::~BasicReporter() {}